

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

CompressionFunction * duckdb::StringUncompressed::GetFunction(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_UNCOMPRESSED;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = UncompressedStringStorage::StringInitAnalyze;
  in_RDI->analyze = UncompressedStringStorage::StringAnalyze;
  in_RDI->final_analyze = UncompressedStringStorage::StringFinalAnalyze;
  in_RDI->init_compression = UncompressedFunctions::InitCompression;
  in_RDI->compress = UncompressedFunctions::Compress;
  in_RDI->compress_finalize = UncompressedFunctions::FinalizeCompress;
  in_RDI->init_prefetch = UncompressedStringInitPrefetch;
  in_RDI->init_scan = UncompressedStringStorage::StringInitScan;
  in_RDI->scan_vector = UncompressedStringStorage::StringScan;
  in_RDI->scan_partial = UncompressedStringStorage::StringScanPartial;
  in_RDI->select = UncompressedStringStorage::Select;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = UncompressedStringStorage::StringFetchRow;
  in_RDI->skip = UncompressedFunctions::EmptySkip;
  in_RDI->init_segment = UncompressedStringStorage::StringInitSegment;
  in_RDI->init_append = UncompressedStringStorage::StringInitAppend;
  in_RDI->append = UncompressedStringStorage::StringAppend;
  in_RDI->finalize_append = UncompressedStringStorage::FinalizeAppend;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = UncompressedStringStorage::SerializeState;
  in_RDI->deserialize_state = UncompressedStringStorage::DeserializeState;
  in_RDI->cleanup_state = UncompressedStringStorage::CleanupState;
  in_RDI->get_segment_info = (compression_get_segment_info_t)0x0;
  in_RDI->validity = REQUIRES_VALIDITY;
  return in_RDI;
}

Assistant:

CompressionFunction StringUncompressed::GetFunction(PhysicalType data_type) {
	D_ASSERT(data_type == PhysicalType::VARCHAR);
	return CompressionFunction(
	    CompressionType::COMPRESSION_UNCOMPRESSED, data_type, UncompressedStringStorage::StringInitAnalyze,
	    UncompressedStringStorage::StringAnalyze, UncompressedStringStorage::StringFinalAnalyze,
	    UncompressedFunctions::InitCompression, UncompressedFunctions::Compress,
	    UncompressedFunctions::FinalizeCompress, UncompressedStringStorage::StringInitScan,
	    UncompressedStringStorage::StringScan, UncompressedStringStorage::StringScanPartial,
	    UncompressedStringStorage::StringFetchRow, UncompressedFunctions::EmptySkip,
	    UncompressedStringStorage::StringInitSegment, UncompressedStringStorage::StringInitAppend,
	    UncompressedStringStorage::StringAppend, UncompressedStringStorage::FinalizeAppend, nullptr,
	    UncompressedStringStorage::SerializeState, UncompressedStringStorage::DeserializeState,
	    UncompressedStringStorage::CleanupState, UncompressedStringInitPrefetch, UncompressedStringStorage::Select);
}